

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

CWalletTx * __thiscall
wallet::CWallet::AddToWallet
          (CWallet *this,CTransactionRef tx,TxState *state,UpdateWalletTxFn *update_wtx,
          bool fFlushOnClose,bool rescanning_old_block)

{
  variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  WalletDatabase *pWVar4;
  long lVar5;
  long *plVar6;
  undefined1 *puVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  undefined8 uVar14;
  bool bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  CTransaction *__tmp;
  _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> _Var19;
  int64_t iVar20;
  iterator iVar21;
  element_type *peVar22;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var23;
  iterator iVar24;
  ulong uVar25;
  bool bVar26;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var27;
  CTxIn *txin;
  uchar *hash_00;
  ulong uVar28;
  CWalletTx *wtx;
  CTransactionRef *tx_00;
  CWalletTx *pCVar29;
  const_iterator it;
  long in_FS_OFFSET;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  initializer_list<wallet::CWalletTx_*> __l;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar32;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar33;
  TxStateInactive inactive_state;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> txs;
  string strCmd;
  uint256 hash;
  byte local_11c;
  char *local_f8;
  WalletBatch local_f0;
  anon_class_1_0_00000001 local_d9;
  unique_lock<std::recursive_mutex> local_d8;
  undefined1 local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  undefined1 auStack_80 [8];
  undefined1 local_78 [32];
  undefined1 local_58 [24];
  pointer ppStack_40;
  pointer local_38;
  
  _Var27 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pCVar29 = (CWalletTx *)
            tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  local_d8._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_d8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_d8);
  pWVar4 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar4 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_f0,pWVar4,(ulong)update_wtx & 0xff);
  lVar5 = *(long *)&(pCVar29->mapValue)._M_t._M_impl;
  local_58._0_8_ = *(size_type *)(lVar5 + 0x39);
  local_58._8_8_ = *(undefined8 *)(lVar5 + 0x41);
  local_58._16_8_ = *(undefined8 *)(lVar5 + 0x49);
  ppStack_40 = *(pointer *)(lVar5 + 0x51);
  local_f0.m_database = pWVar4;
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 1) != 0) {
    local_78._8_8_ = auStack_80;
    auStack_80 = (undefined1  [8])((ulong)(uint)auStack_80._4_4_ << 0x20);
    local_78._0_8_ = (_Base_ptr)0x0;
    local_78._24_8_ = (_Base_ptr)0x0;
    plVar6 = *(long **)&(pCVar29->mapValue)._M_t._M_impl;
    hash_00 = (uchar *)*plVar6;
    puVar7 = (undefined1 *)plVar6[1];
    local_78._16_8_ = local_78._8_8_;
    if (hash_00 != puVar7) {
      do {
        SetSpentKeyState(this,&local_f0,(uint256 *)hash_00,
                         *(uint *)(((uint256 *)(hash_00 + 0x20))->super_base_blob<256U>).m_data.
                                  _M_elems,true,
                         (set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                          *)local_88);
        hash_00 = hash_00 + 0x68;
      } while (hash_00 != puVar7);
    }
    MarkDestinationsDirty
              (this,(set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                     *)local_88);
    std::
    _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::_Identity<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
    ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::_Identity<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                 *)local_88);
  }
  local_a8._M_dataplus._M_p = local_58;
  local_88 = (undefined1  [8])_Var27._M_pi;
  auStack_80 = (undefined1  [8])pCVar29;
  pVar32 = std::
           _Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::
           _M_emplace<std::piecewise_construct_t_const&,std::tuple<uint256&>,std::tuple<std::shared_ptr<CTransaction_const>&,std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&>>
                     ((_Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)&this->mapWallet,&std::piecewise_construct);
  _Var19 = pVar32.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
           ._M_cur;
  bVar26 = pVar32.second;
  wtx = (CWalletTx *)
        ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
               _M_cur + 0x28);
  if (*(long *)((long)&(state->
                       super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       ).
                       super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       ._M_u + 0x10) == 0) {
    local_11c = 0;
  }
  else {
    local_88 = (undefined1  [8])(CONCAT71(local_88._1_7_,bVar26) & 0xffffffffffffff01);
    local_11c = (**(code **)((long)&(state->
                                    super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                                    ).
                                    super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                                    .
                                    super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                                    .
                                    super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                                    .
                                    super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                                    .
                                    super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                                    ._M_u + 0x18))(state);
  }
  if (((undefined1  [16])pVar32 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar3 = (byte)_Var27._M_pi[2]._M_use_count;
    pvVar1 = (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)((long)_Var19.
                       super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                       _M_cur + 0x1d0);
    if (bVar3 == *(byte *)((long)_Var19.
                                 super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                 ._M_cur + 0x1f8)) {
      iVar17 = (*std::__detail::__variant::
                 __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:114:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:115:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:116:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:117:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:118:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                 ::_S_vtable._M_arr[bVar3]._M_data)
                         ((Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:118:9)>
                           *)local_88,pvVar1);
      iVar18 = (*std::__detail::__variant::
                 __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:114:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:115:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:116:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:117:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:118:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                 ::_S_vtable._M_arr[(byte)_Var27._M_pi[2]._M_use_count]._M_data)
                         ((Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:118:9)>
                           *)local_88,
                          (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                           *)_Var27._M_pi);
      if (iVar17 != iVar18) {
        __assert_fail("TxStateSerializedIndex(wtx.m_state) == TxStateSerializedIndex(state)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x454,
                      "CWalletTx *wallet::CWallet::AddToWallet(CTransactionRef, const TxState &, const UpdateWalletTxFn &, bool, bool)"
                     );
      }
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<uint256>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:102:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:103:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:104:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:105:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:106:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
        ::_S_vtable._M_arr
        [*(byte *)((long)_Var19.
                         super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                         ._M_cur + 0x1f8)]._M_data)
                ((uint256 *)local_88,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)&local_a8,pvVar1);
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<uint256>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:102:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:103:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:104:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:105:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:106:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
        ::_S_vtable._M_arr[(byte)_Var27._M_pi[2]._M_use_count]._M_data)
                ((uint256 *)&local_a8,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)local_c8,
                 (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  *)_Var27._M_pi);
      auVar30[0] = -(local_a8._M_dataplus._M_p._0_1_ == local_88[0]);
      auVar30[1] = -(local_a8._M_dataplus._M_p._1_1_ == local_88[1]);
      auVar30[2] = -(local_a8._M_dataplus._M_p._2_1_ == local_88[2]);
      auVar30[3] = -(local_a8._M_dataplus._M_p._3_1_ == local_88[3]);
      auVar30[4] = -(local_a8._M_dataplus._M_p._4_1_ == local_88[4]);
      auVar30[5] = -(local_a8._M_dataplus._M_p._5_1_ == local_88[5]);
      auVar30[6] = -(local_a8._M_dataplus._M_p._6_1_ == local_88[6]);
      auVar30[7] = -(local_a8._M_dataplus._M_p._7_1_ == local_88[7]);
      auVar30[8] = -((undefined1)local_a8._M_string_length == auStack_80[0]);
      auVar30[9] = -(local_a8._M_string_length._1_1_ == auStack_80[1]);
      auVar30[10] = -(local_a8._M_string_length._2_1_ == auStack_80[2]);
      auVar30[0xb] = -(local_a8._M_string_length._3_1_ == auStack_80[3]);
      auVar30[0xc] = -(local_a8._M_string_length._4_1_ == auStack_80[4]);
      auVar30[0xd] = -(local_a8._M_string_length._5_1_ == auStack_80[5]);
      auVar30[0xe] = -(local_a8._M_string_length._6_1_ == auStack_80[6]);
      auVar30[0xf] = -(local_a8._M_string_length._7_1_ == auStack_80[7]);
      auVar31[0] = -(local_a8.field_2._M_local_buf[0] == local_78[0]);
      auVar31[1] = -(local_a8.field_2._M_local_buf[1] == local_78[1]);
      auVar31[2] = -(local_a8.field_2._M_local_buf[2] == local_78[2]);
      auVar31[3] = -(local_a8.field_2._M_local_buf[3] == local_78[3]);
      auVar31[4] = -(local_a8.field_2._M_local_buf[4] == local_78[4]);
      auVar31[5] = -(local_a8.field_2._M_local_buf[5] == local_78[5]);
      auVar31[6] = -(local_a8.field_2._M_local_buf[6] == local_78[6]);
      auVar31[7] = -(local_a8.field_2._M_local_buf[7] == local_78[7]);
      auVar31[8] = -(local_a8.field_2._M_local_buf[8] == local_78[8]);
      auVar31[9] = -(local_a8.field_2._M_local_buf[9] == local_78[9]);
      auVar31[10] = -(local_a8.field_2._M_local_buf[10] == local_78[10]);
      auVar31[0xb] = -(local_a8.field_2._M_local_buf[0xb] == local_78[0xb]);
      auVar31[0xc] = -(local_a8.field_2._M_local_buf[0xc] == local_78[0xc]);
      auVar31[0xd] = -(local_a8.field_2._M_local_buf[0xd] == local_78[0xd]);
      auVar31[0xe] = -(local_a8.field_2._M_local_buf[0xe] == local_78[0xe]);
      auVar31[0xf] = -(local_a8.field_2._M_local_buf[0xf] == local_78[0xf]);
      auVar30 = auVar30 & auVar31;
      if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) != 0xffff) {
        __assert_fail("TxStateSerializedBlockHash(wtx.m_state) == TxStateSerializedBlockHash(state)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x455,
                      "CWalletTx *wallet::CWallet::AddToWallet(CTransactionRef, const TxState &, const UpdateWalletTxFn &, bool, bool)"
                     );
      }
    }
    else {
      uVar10 = *(undefined8 *)
                &(((mapValue_t *)&(_Var27._M_pi)->_vptr__Sp_counted_base)->_M_t)._M_impl;
      uVar11 = *(undefined8 *)&((_Rb_tree_header *)&(_Var27._M_pi)->_M_use_count)->_M_header;
      p_Var12 = (_Base_ptr)_Var27._M_pi[1]._vptr__Sp_counted_base;
      p_Var13 = *(_Base_ptr *)&_Var27._M_pi[1]._M_use_count;
      uVar14 = *(undefined8 *)((long)&_Var27._M_pi[2]._vptr__Sp_counted_base + 1);
      *(undefined8 *)
       ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1e9) = *(undefined8 *)((long)&_Var27._M_pi[1]._M_use_count + 1);
      *(undefined8 *)
       ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1f1) = uVar14;
      *(_Base_ptr *)
       ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1e0) = p_Var12;
      *(_Base_ptr *)
       ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1e8) = p_Var13;
      *(undefined8 *)
       &(pvVar1->
        super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        ).
        super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        ._M_u = uVar10;
      *(undefined8 *)
       ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1d8) = uVar11;
      local_11c = 1;
    }
    lVar5 = *(long *)&(pCVar29->mapValue)._M_t._M_impl;
    if ((*(char *)(lVar5 + 0x38) == '\x01') &&
       (*(char *)(*(long *)((long)_Var19.
                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ._M_cur + 0x1c0) + 0x38) == '\0')) {
      lVar8 = *(long *)&(pCVar29->mapValue)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (lVar8 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar8 + 8) = *(int *)(lVar8 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar8 + 8) = *(int *)(lVar8 + 8) + 1;
        }
      }
      *(long *)((long)_Var19.
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                      _M_cur + 0x1c0) = lVar5;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)_Var19.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x1c8);
      *(long *)((long)_Var19.
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                      _M_cur + 0x1c8) = lVar8;
      local_11c = 1;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  else {
    iVar20 = GetTime();
    *(int *)((long)_Var19.
                   super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                   _M_cur + 0x74) = (int)iVar20;
    pCVar29 = (CWalletTx *)this->nOrderPosNext;
    puVar7 = &(pCVar29->mapValue)._M_t._M_impl.field_0x1;
    this->nOrderPosNext = (int64_t)puVar7;
    WalletBatch::WriteOrderPosNext(&local_f0,(int64_t)puVar7);
    *(CWalletTx **)
     ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x80) = pCVar29;
    local_88 = (undefined1  [8])pCVar29;
    auStack_80 = (undefined1  [8])wtx;
    iVar21 = std::
             _Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
             ::_M_emplace_equal<std::pair<long,wallet::CWalletTx*>>
                       ((_Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                         *)&this->wtxOrdered,(pair<long,_wallet::CWalletTx_*> *)local_88);
    *(_Base_ptr *)
     ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x88) = iVar21._M_node;
    uVar16 = ComputeTimeSmart(this,wtx,fFlushOnClose);
    *(uint *)((long)_Var19.
                    super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                    _M_cur + 0x78) = uVar16;
    AddToSpends(this,wtx,&local_f0);
    iVar20 = CWalletTx::GetTxTime(wtx);
    if (iVar20 < (this->m_birth_time).super___atomic_base<long>._M_i) {
      LOCK();
      (this->m_birth_time).super___atomic_base<long>._M_i = iVar20;
      UNLOCK();
    }
  }
  bVar15 = CTransaction::IsCoinBase
                     (*(CTransaction **)
                       ((long)_Var19.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x1c0));
  if ((bVar15) &&
     (*(char *)((long)_Var19.
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                      _M_cur + 0x1f8) == '\x03')) {
    __l._M_len = 1;
    __l._M_array = (iterator)local_88;
    local_88 = (undefined1  [8])wtx;
    std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::vector
              ((vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> *)&local_a8,__l,
               (allocator_type *)local_c8);
    local_f8 = (char *)CONCAT71(local_f8._1_7_,1);
    if (local_a8._M_dataplus._M_p != (pointer)local_a8._M_string_length) {
      do {
        pCVar29 = *(CWalletTx **)(local_a8._M_string_length + -8);
        local_a8._M_string_length = local_a8._M_string_length + -8;
        std::
        variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
        ::operator=((variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
                     *)&pCVar29->m_state,(TxStateInactive *)&local_f8);
        pCVar29->m_amounts[0].m_cached.super__Base_bitset<1UL>._M_w = 0;
        pCVar29->m_amounts[1].m_cached.super__Base_bitset<1UL>._M_w = 0;
        pCVar29->m_amounts[2].m_cached.super__Base_bitset<1UL>._M_w = 0;
        pCVar29->m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w = 0;
        pCVar29->m_is_cache_empty = true;
        pCVar29->fChangeCached = false;
        WalletBatch::WriteTx(&local_f0,pCVar29);
        tx_00 = &pCVar29->tx;
        MarkInputsDirty(this,tx_00);
        peVar22 = (tx_00->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        if ((peVar22->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (peVar22->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar28 = 0;
          do {
            local_88 = *(undefined1 (*) [8])
                        (peVar22->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            auStack_80 = *(undefined1 (*) [8])
                          ((peVar22->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            local_78._0_8_ =
                 *(undefined8 *)
                  ((peVar22->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            local_78._8_8_ =
                 *(undefined8 *)
                  ((peVar22->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            local_78._16_4_ = (int)uVar28;
            pVar33 = std::
                     _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                     ::equal_range(&(this->mapTxSpends)._M_h,(key_type *)local_88);
            for (_Var23._M_cur =
                      (__node_type *)
                      pVar33.first.
                      super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
                (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var23._M_cur !=
                pVar33.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                _M_cur.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
                _Var23._M_cur = (__node_type *)((_Var23._M_cur)->super__Hash_node_base)._M_nxt) {
              iVar24 = _GLOBAL__N_1::std::
                       _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&this->mapWallet,
                              (key_type *)
                              ((long)&((_Var23._M_cur)->
                                      super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>
                                      ._M_storage._M_storage + 0x24));
              if (iVar24.
                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                  _M_cur != (__node_type *)0x0) {
                local_c8._0_8_ =
                     (long)iVar24.
                           super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                           ._M_cur + 0x28;
                std::vector<wallet::CWalletTx*,std::allocator<wallet::CWalletTx*>>::
                emplace_back<wallet::CWalletTx*>
                          ((vector<wallet::CWalletTx*,std::allocator<wallet::CWalletTx*>> *)
                           &local_a8,(CWalletTx **)local_c8);
              }
            }
            peVar22 = (tx_00->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            uVar28 = (ulong)((int)uVar28 + 1);
            uVar25 = ((long)(peVar22->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(peVar22->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          } while (uVar28 <= uVar25 && uVar25 - uVar28 != 0);
        }
      } while (local_a8._M_dataplus._M_p != (pointer)local_a8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT17(local_a8.field_2._M_local_buf[7],
                               CONCAT16(local_a8.field_2._M_local_buf[6],
                                        CONCAT15(local_a8.field_2._M_local_buf[5],
                                                 CONCAT14(local_a8.field_2._M_local_buf[4],
                                                          CONCAT13(local_a8.field_2._M_local_buf[3],
                                                                   CONCAT12(local_a8.field_2.
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_a8.
                                                  field_2._M_local_buf[1],
                                                  local_a8.field_2._M_local_buf[0]))))))) -
                      (long)local_a8._M_dataplus._M_p);
    }
  }
  base_blob<256u>::ToString_abi_cxx11_((string *)local_88,local_58);
  local_c8._0_8_ = "new";
  if (((undefined1  [16])pVar32 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_c8._0_8_ = "";
  }
  local_f8 = "update";
  if (local_11c == 0) {
    local_f8 = "";
  }
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:126:23)_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
    ::_S_vtable._M_arr[(byte)_Var27._M_pi[2]._M_use_count]._M_data)
            (&local_a8,&local_d9,
             (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)_Var27._M_pi);
  WalletLogPrintf<std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
            (this,(ConstevalFormatString<4U>)0x82e209,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (char **)local_c8,&local_f8,&local_a8);
  paVar2 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT17(local_a8.field_2._M_local_buf[7],
                             CONCAT16(local_a8.field_2._M_local_buf[6],
                                      CONCAT15(local_a8.field_2._M_local_buf[5],
                                               CONCAT14(local_a8.field_2._M_local_buf[4],
                                                        CONCAT13(local_a8.field_2._M_local_buf[3],
                                                                 CONCAT12(local_a8.field_2.
                                                                          _M_local_buf[2],
                                                                          CONCAT11(local_a8.field_2.
                                                                                   _M_local_buf[1],
                                                                                   local_a8.field_2.
                                                                                   _M_local_buf[0]))
                                                                ))))) + 1);
  }
  if (local_88 != (undefined1  [8])local_78) {
    operator_delete((void *)local_88,(ulong)(local_78._0_8_ + 1));
  }
  if ((((local_11c | bVar26) & 1) == 0) || (bVar15 = WalletBatch::WriteTx(&local_f0,wtx), bVar15)) {
    *(undefined8 *)
     ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x90) = 0;
    *(undefined8 *)
     ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0xd8) = 0;
    *(undefined8 *)
     ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x120) = 0;
    *(undefined8 *)
     ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x168) = 0;
    *(undefined2 *)
     ((long)_Var19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x1b0) = 1;
    boost::signals2::
    signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyTransactionChanged,(uint256 *)local_58,(byte)~bVar26 & CT_UPDATED);
    pcVar9 = (this->m_notify_tx_changed_script)._M_dataplus._M_p;
    local_88 = (undefined1  [8])local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar9,
               pcVar9 + (this->m_notify_tx_changed_script)._M_string_length);
    if (auStack_80 != (undefined1  [8])0x0) {
      local_a8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"%s","");
      base_blob<256u>::GetHex_abi_cxx11_((string *)local_c8,local_58);
      util::ReplaceAll((string *)local_88,&local_a8,(string *)local_c8);
      pCVar29 = (CWalletTx *)(local_c8 + 0x10);
      if ((CWalletTx *)local_c8._0_8_ != pCVar29) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 CONCAT16(local_a8.field_2._M_local_buf[6],
                                          CONCAT15(local_a8.field_2._M_local_buf[5],
                                                   CONCAT14(local_a8.field_2._M_local_buf[4],
                                                            CONCAT13(local_a8.field_2._M_local_buf
                                                                     [3],CONCAT12(local_a8.field_2.
                                                                                  _M_local_buf[2],
                                                                                  CONCAT11(local_a8.
                                                  field_2._M_local_buf[1],
                                                  local_a8.field_2._M_local_buf[0]))))))) + 1);
      }
      if (*(char *)((long)_Var19.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1f8) == '\0') {
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"%b","");
        base_blob<256u>::GetHex_abi_cxx11_
                  ((string *)local_c8,
                   (void *)((long)_Var19.
                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ._M_cur + 0x1d0));
        util::ReplaceAll((string *)local_88,&local_a8,(string *)local_c8);
        if ((CWalletTx *)local_c8._0_8_ != pCVar29) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT17(local_a8.field_2._M_local_buf[7],
                                   CONCAT16(local_a8.field_2._M_local_buf[6],
                                            CONCAT15(local_a8.field_2._M_local_buf[5],
                                                     CONCAT14(local_a8.field_2._M_local_buf[4],
                                                              CONCAT13(local_a8.field_2._M_local_buf
                                                                       [3],CONCAT12(local_a8.field_2
                                                                                    ._M_local_buf[2]
                                                                                    ,CONCAT11(
                                                  local_a8.field_2._M_local_buf[1],
                                                  local_a8.field_2._M_local_buf[0]))))))) + 1);
        }
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"%h","");
        util::ToString<int>((string *)local_c8,
                            (int *)((long)_Var19.
                                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                          ._M_cur + 0x1f0));
        util::ReplaceAll((string *)local_88,&local_a8,(string *)local_c8);
      }
      else {
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"%b","");
        local_c8._0_8_ = pCVar29;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"unconfirmed","");
        util::ReplaceAll((string *)local_88,&local_a8,(string *)local_c8);
        if ((CWalletTx *)local_c8._0_8_ != pCVar29) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT17(local_a8.field_2._M_local_buf[7],
                                   CONCAT16(local_a8.field_2._M_local_buf[6],
                                            CONCAT15(local_a8.field_2._M_local_buf[5],
                                                     CONCAT14(local_a8.field_2._M_local_buf[4],
                                                              CONCAT13(local_a8.field_2._M_local_buf
                                                                       [3],CONCAT12(local_a8.field_2
                                                                                    ._M_local_buf[2]
                                                                                    ,CONCAT11(
                                                  local_a8.field_2._M_local_buf[1],
                                                  local_a8.field_2._M_local_buf[0]))))))) + 1);
        }
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"%h","");
        local_c8._0_8_ = pCVar29;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"-1","");
        util::ReplaceAll((string *)local_88,&local_a8,(string *)local_c8);
      }
      if ((CWalletTx *)local_c8._0_8_ != pCVar29) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 CONCAT16(local_a8.field_2._M_local_buf[6],
                                          CONCAT15(local_a8.field_2._M_local_buf[5],
                                                   CONCAT14(local_a8.field_2._M_local_buf[4],
                                                            CONCAT13(local_a8.field_2._M_local_buf
                                                                     [3],CONCAT12(local_a8.field_2.
                                                                                  _M_local_buf[2],
                                                                                  CONCAT11(local_a8.
                                                  field_2._M_local_buf[1],
                                                  local_a8.field_2._M_local_buf[0]))))))) + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"%w","");
      ShellEscape((string *)local_c8,&this->m_name);
      util::ReplaceAll((string *)local_88,&local_a8,(string *)local_c8);
      if ((CWalletTx *)local_c8._0_8_ != pCVar29) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 CONCAT16(local_a8.field_2._M_local_buf[6],
                                          CONCAT15(local_a8.field_2._M_local_buf[5],
                                                   CONCAT14(local_a8.field_2._M_local_buf[4],
                                                            CONCAT13(local_a8.field_2._M_local_buf
                                                                     [3],CONCAT12(local_a8.field_2.
                                                                                  _M_local_buf[2],
                                                                                  CONCAT11(local_a8.
                                                  field_2._M_local_buf[1],
                                                  local_a8.field_2._M_local_buf[0]))))))) + 1);
      }
      std::thread::thread<void(&)(std::__cxx11::string_const&),std::__cxx11::string&,void>
                ((thread *)&local_a8,runCommand,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::thread::detach();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::terminate();
      }
    }
    if (local_88 != (undefined1  [8])local_78) {
      operator_delete((void *)local_88,(ulong)(local_78._0_8_ + 1));
    }
  }
  else {
    wtx = (CWalletTx *)0x0;
  }
  if (local_f0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_f0.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_d8);
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return wtx;
}

Assistant:

CWalletTx* CWallet::AddToWallet(CTransactionRef tx, const TxState& state, const UpdateWalletTxFn& update_wtx, bool fFlushOnClose, bool rescanning_old_block)
{
    LOCK(cs_wallet);

    WalletBatch batch(GetDatabase(), fFlushOnClose);

    uint256 hash = tx->GetHash();

    if (IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE)) {
        // Mark used destinations
        std::set<CTxDestination> tx_destinations;

        for (const CTxIn& txin : tx->vin) {
            const COutPoint& op = txin.prevout;
            SetSpentKeyState(batch, op.hash, op.n, true, tx_destinations);
        }

        MarkDestinationsDirty(tx_destinations);
    }

    // Inserts only if not already there, returns tx inserted or tx found
    auto ret = mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(hash), std::forward_as_tuple(tx, state));
    CWalletTx& wtx = (*ret.first).second;
    bool fInsertedNew = ret.second;
    bool fUpdated = update_wtx && update_wtx(wtx, fInsertedNew);
    if (fInsertedNew) {
        wtx.nTimeReceived = GetTime();
        wtx.nOrderPos = IncOrderPosNext(&batch);
        wtx.m_it_wtxOrdered = wtxOrdered.insert(std::make_pair(wtx.nOrderPos, &wtx));
        wtx.nTimeSmart = ComputeTimeSmart(wtx, rescanning_old_block);
        AddToSpends(wtx, &batch);

        // Update birth time when tx time is older than it.
        MaybeUpdateBirthTime(wtx.GetTxTime());
    }

    if (!fInsertedNew)
    {
        if (state.index() != wtx.m_state.index()) {
            wtx.m_state = state;
            fUpdated = true;
        } else {
            assert(TxStateSerializedIndex(wtx.m_state) == TxStateSerializedIndex(state));
            assert(TxStateSerializedBlockHash(wtx.m_state) == TxStateSerializedBlockHash(state));
        }
        // If we have a witness-stripped version of this transaction, and we
        // see a new version with a witness, then we must be upgrading a pre-segwit
        // wallet.  Store the new version of the transaction with the witness,
        // as the stripped-version must be invalid.
        // TODO: Store all versions of the transaction, instead of just one.
        if (tx->HasWitness() && !wtx.tx->HasWitness()) {
            wtx.SetTx(tx);
            fUpdated = true;
        }
    }

    // Mark inactive coinbase transactions and their descendants as abandoned
    if (wtx.IsCoinBase() && wtx.isInactive()) {
        std::vector<CWalletTx*> txs{&wtx};

        TxStateInactive inactive_state = TxStateInactive{/*abandoned=*/true};

        while (!txs.empty()) {
            CWalletTx* desc_tx = txs.back();
            txs.pop_back();
            desc_tx->m_state = inactive_state;
            // Break caches since we have changed the state
            desc_tx->MarkDirty();
            batch.WriteTx(*desc_tx);
            MarkInputsDirty(desc_tx->tx);
            for (unsigned int i = 0; i < desc_tx->tx->vout.size(); ++i) {
                COutPoint outpoint(desc_tx->GetHash(), i);
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(outpoint);
                for (TxSpends::const_iterator it = range.first; it != range.second; ++it) {
                    const auto wit = mapWallet.find(it->second);
                    if (wit != mapWallet.end()) {
                        txs.push_back(&wit->second);
                    }
                }
            }
        }
    }

    //// debug print
    WalletLogPrintf("AddToWallet %s  %s%s %s\n", hash.ToString(), (fInsertedNew ? "new" : ""), (fUpdated ? "update" : ""), TxStateString(state));

    // Write to disk
    if (fInsertedNew || fUpdated)
        if (!batch.WriteTx(wtx))
            return nullptr;

    // Break debit/credit balance caches:
    wtx.MarkDirty();

    // Notify UI of new or updated transaction
    NotifyTransactionChanged(hash, fInsertedNew ? CT_NEW : CT_UPDATED);

#if HAVE_SYSTEM
    // notify an external script when a wallet transaction comes in or is updated
    std::string strCmd = m_notify_tx_changed_script;

    if (!strCmd.empty())
    {
        ReplaceAll(strCmd, "%s", hash.GetHex());
        if (auto* conf = wtx.state<TxStateConfirmed>())
        {
            ReplaceAll(strCmd, "%b", conf->confirmed_block_hash.GetHex());
            ReplaceAll(strCmd, "%h", ToString(conf->confirmed_block_height));
        } else {
            ReplaceAll(strCmd, "%b", "unconfirmed");
            ReplaceAll(strCmd, "%h", "-1");
        }
#ifndef WIN32
        // Substituting the wallet name isn't currently supported on windows
        // because windows shell escaping has not been implemented yet:
        // https://github.com/bitcoin/bitcoin/pull/13339#issuecomment-537384875
        // A few ways it could be implemented in the future are described in:
        // https://github.com/bitcoin/bitcoin/pull/13339#issuecomment-461288094
        ReplaceAll(strCmd, "%w", ShellEscape(GetName()));
#endif
        std::thread t(runCommand, strCmd);
        t.detach(); // thread runs free
    }
#endif

    return &wtx;
}